

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_NlsConvTest(SUNNonlinearSolver NLS,N_Vector y,N_Vector del,sunrealtype tol,N_Vector ewt,
                       void *arkode_mem)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  int retval;
  int m;
  sunrealtype dcon;
  sunrealtype delnrm;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  int local_5c [3];
  double local_50;
  long local_48;
  undefined8 local_30;
  double local_28;
  undefined8 local_20;
  undefined8 local_10;
  int local_4;
  
  local_30 = in_RCX;
  local_28 = in_XMM0_Qa;
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_4 = mriStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                       ,(ARKodeMRIStepMem *)0x167f8e);
  if (local_4 == 0) {
    if (*(int *)(local_48 + 0x10) == 0) {
      local_50 = (double)N_VWrmsNorm(local_20,local_30);
      iVar1 = SUNNonlinSolGetCurIter(local_10,local_5c);
      if (iVar1 == 0) {
        if (0 < local_5c[0]) {
          if (*(double *)(local_48 + 0xd8) * *(double *)(local_48 + 0xe8) <=
              local_50 / *(double *)(local_48 + 0xf0)) {
            dVar2 = local_50 / *(double *)(local_48 + 0xf0);
          }
          else {
            dVar2 = *(double *)(local_48 + 0xd8) * *(double *)(local_48 + 0xe8);
          }
          *(double *)(local_48 + 0xe8) = dVar2;
        }
        if (1.0 < *(double *)(local_48 + 0xe8) || *(double *)(local_48 + 0xe8) == 1.0) {
          dVar2 = 1.0;
        }
        else {
          dVar2 = *(double *)(local_48 + 0xe8);
        }
        if (1.0 < (dVar2 * local_50) / local_28) {
          if ((local_5c[0] < 1) ||
             (local_50 <= *(double *)(local_48 + 0xe0) * *(double *)(local_48 + 0xf0))) {
            *(double *)(local_48 + 0xf0) = local_50;
            local_4 = 0x385;
          }
          else {
            local_4 = 0x386;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = -0x15;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mriStep_NlsConvTest(SUNNonlinearSolver NLS,
                        SUNDIALS_MAYBE_UNUSED N_Vector y, N_Vector del,
                        sunrealtype tol, N_Vector ewt, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  sunrealtype delnrm, dcon;
  int m, retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if the problem is linearly implicit, just return success */
  if (step_mem->linear) { return (SUN_SUCCESS); }

  /* compute the norm of the correction */
  delnrm = N_VWrmsNorm(del, ewt);

  /* get the current nonlinear solver iteration count */
  retval = SUNNonlinSolGetCurIter(NLS, &m);
  if (retval != ARK_SUCCESS) { return (ARK_MEM_NULL); }

  /* update the stored estimate of the convergence rate (assumes linear convergence) */
  if (m > 0)
  {
    step_mem->crate = SUNMAX(step_mem->crdown * step_mem->crate,
                             delnrm / step_mem->delp);
  }

  /* compute our scaled error norm for testing convergence */
  dcon = SUNMIN(step_mem->crate, ONE) * delnrm / tol;

  /* check for convergence; if so return with success */
  if (dcon <= ONE) { return (SUN_SUCCESS); }

  /* check for divergence */
  if ((m >= 1) && (delnrm > step_mem->rdiv * step_mem->delp))
  {
    return (SUN_NLS_CONV_RECVR);
  }

  /* save norm of correction for next iteration */
  step_mem->delp = delnrm;

  /* return with flag that there is more work to do */
  return (SUN_NLS_CONTINUE);
}